

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O2

exr_result_t save_attr(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  uint64_t *puVar1;
  uint uVar2;
  exr_attr_chromaticities_t *peVar3;
  exr_attr_m33d_t *peVar4;
  exr_attr_rational_t *peVar5;
  exr_attr_m33f_t *peVar6;
  exr_attr_chlist_t *peVar7;
  exr_result_t eVar8;
  int iVar9;
  _func_exr_result_t__internal_exr_context_ptr_void_ptr_uint64_t_uint64_t_ptr
  *UNRECOVERED_JUMPTABLE_00;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t *UNRECOVERED_JUMPTABLE;
  void *__dest;
  ulong uVar10;
  uint64_t uVar11;
  ulong uVar12;
  exr_attr_chlist_entry_t *peVar13;
  size_t sz;
  exr_attr_v2i_t *peVar14;
  int c;
  long lVar15;
  int i;
  long lVar16;
  uint64_t uStack_d0;
  int32_t tmp;
  uint8_t flags [4];
  uint8_t eol;
  double tmp_2;
  float fStack_b0;
  float fStack_ac;
  double local_a8;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  
  puVar1 = &ctxt->output_file_offset;
  eVar8 = (*ctxt->do_write)(ctxt,a->name,(ulong)a->name_length + 1,puVar1);
  if (eVar8 != 0) {
    return eVar8;
  }
  eVar8 = (*ctxt->do_write)(ctxt,a->type_name,(ulong)a->type_name_length + 1,puVar1);
  if (eVar8 != 0) {
    return eVar8;
  }
  switch(a->type) {
  case EXR_ATTR_BOX2I:
  case EXR_ATTR_BOX2F:
  case EXR_ATTR_V2D:
    peVar3 = (a->field_6).chromaticities;
    tmp_2 = *(double *)peVar3;
    fStack_b0 = peVar3->green_x;
    fStack_ac = peVar3->green_y;
    tmp = 0x10;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0x10;
    break;
  case EXR_ATTR_CHLIST:
    uVar2 = ((a->field_6).chlist)->num_channels;
    uVar12 = 0;
    uVar10 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar10 = uVar12;
    }
    lVar15 = 0;
    for (; uVar10 * 0x20 != uVar12; uVar12 = uVar12 + 0x20) {
      lVar15 = lVar15 + *(int *)(((a->field_6).chlist)->entries->reserved + (uVar12 - 0x15)) + 0x11;
    }
    iVar9 = save_attr_sz(ctxt,lVar15 + 1);
    lVar15 = 0x1c;
    lVar16 = 0;
    while( true ) {
      if (iVar9 != 0) {
        return iVar9;
      }
      if (((a->field_6).chlist)->num_channels <= lVar16) break;
      peVar13 = ((a->field_6).chlist)->entries;
      tmp = *(int32_t *)(peVar13->reserved + lVar15 + -0x21);
      tmp_2 = (double)CONCAT44(*(undefined4 *)(peVar13->reserved + lVar15 + -0x15),
                               *(undefined4 *)(peVar13->reserved + lVar15 + -0x19));
      flags[0] = peVar13->reserved[lVar15 + -0x1d];
      flags[3] = '\0';
      flags[1] = '\0';
      flags[2] = '\0';
      eVar8 = (*ctxt->do_write)(ctxt,*(void **)(peVar13->reserved + lVar15 + -0x29),
                                (long)*(int *)(peVar13->reserved + lVar15 + -0x31) + 1,puVar1);
      if (eVar8 != 0) {
        return eVar8;
      }
      eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
      if (eVar8 != 0) {
        return eVar8;
      }
      eVar8 = (*ctxt->do_write)(ctxt,flags,4,puVar1);
      if (eVar8 != 0) {
        return eVar8;
      }
      iVar9 = (*ctxt->do_write)(ctxt,&tmp_2,8,puVar1);
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x20;
    }
    peVar14 = (exr_attr_v2i_t *)&eol;
    eol = '\0';
    goto LAB_0011b9d0;
  case EXR_ATTR_CHROMATICITIES:
    peVar3 = (a->field_6).chromaticities;
    tmp_2 = *(double *)peVar3;
    fStack_b0 = peVar3->green_x;
    fStack_ac = peVar3->green_y;
    local_a8 = *(double *)&peVar3->blue_x;
    fStack_a0 = peVar3->white_x;
    fStack_9c = peVar3->white_y;
    tmp = 0x20;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0x20;
    break;
  case EXR_ATTR_COMPRESSION:
  case EXR_ATTR_ENVMAP:
  case EXR_ATTR_LINEORDER:
    eVar8 = save_attr_uint8(ctxt,a);
    return eVar8;
  case EXR_ATTR_DOUBLE:
    tmp_2 = (a->field_6).d;
    goto LAB_0011b3c7;
  case EXR_ATTR_FLOAT:
    tmp = (a->field_6).i;
    goto LAB_0011b626;
  case EXR_ATTR_FLOAT_VECTOR:
    eVar8 = save_attr_sz(ctxt,(long)((a->field_6).chlist)->num_channels << 2);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar7 = (a->field_6).chlist;
    lVar15 = (long)peVar7->num_channels;
    if (lVar15 < 1) {
      return 0;
    }
    if (0 < peVar7->num_alloced) {
      peVar13 = peVar7->entries;
      UNRECOVERED_JUMPTABLE_00 = ctxt->do_write;
      uVar11 = lVar15 << 2;
      goto LAB_0011b8b1;
    }
    __dest = (*ctxt->alloc_fn)(lVar15 << 2);
    if (__dest != (void *)0x0) {
      memcpy(__dest,((a->field_6).chlist)->entries,(long)((a->field_6).chlist)->num_channels << 2);
      eVar8 = (*ctxt->do_write)(ctxt,__dest,(long)((a->field_6).chlist)->num_channels << 2,puVar1);
      (*ctxt->free_fn)(__dest);
      return eVar8;
    }
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    uStack_d0._0_4_ = 1;
    goto LAB_0011b92a;
  case EXR_ATTR_INT:
    tmp = (a->field_6).i;
LAB_0011b626:
    tmp_2 = (double)CONCAT44(tmp_2._4_4_,4);
    eVar8 = (*ctxt->do_write)(ctxt,&tmp_2,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp;
    uStack_d0 = 4;
    break;
  case EXR_ATTR_KEYCODE:
    peVar3 = (a->field_6).chromaticities;
    tmp_2 = *(double *)peVar3;
    fStack_b0 = peVar3->green_x;
    fStack_ac = peVar3->green_y;
    local_a8 = *(double *)&peVar3->blue_x;
    fStack_a0 = peVar3->white_x;
    tmp = 0x1c;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0x1c;
    break;
  case EXR_ATTR_M33F:
    peVar6 = (a->field_6).m33f;
    local_98 = peVar6->m[8];
    tmp_2 = *(double *)peVar6->m;
    fStack_b0 = peVar6->m[2];
    fStack_ac = peVar6->m[3];
    local_a8 = *(double *)(peVar6->m + 4);
    fStack_a0 = peVar6->m[6];
    fStack_9c = peVar6->m[7];
    tmp = 0x24;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0x24;
    break;
  case EXR_ATTR_M33D:
    memcpy(&tmp_2,(a->field_6).box2i,0x48);
    tmp = 0x48;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0x48;
    break;
  case EXR_ATTR_M44F:
    peVar4 = (a->field_6).m33d;
    tmp_2 = peVar4->m[0];
    fStack_b0 = *(float *)(peVar4->m + 1);
    fStack_ac = *(float *)((long)peVar4->m + 0xc);
    local_a8 = peVar4->m[2];
    fStack_a0 = *(float *)(peVar4->m + 3);
    fStack_9c = *(float *)((long)peVar4->m + 0x1c);
    local_98 = *(float *)(peVar4->m + 4);
    uStack_94 = *(undefined4 *)((long)peVar4->m + 0x24);
    uStack_90 = *(undefined4 *)(peVar4->m + 5);
    uStack_8c = *(undefined4 *)((long)peVar4->m + 0x2c);
    local_88 = *(undefined4 *)(peVar4->m + 6);
    uStack_84 = *(undefined4 *)((long)peVar4->m + 0x34);
    uStack_80 = *(undefined4 *)(peVar4->m + 7);
    uStack_7c = *(undefined4 *)((long)peVar4->m + 0x3c);
    tmp = 0x40;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0x40;
    break;
  case EXR_ATTR_M44D:
    memcpy(&tmp_2,(a->field_6).box2i,0x80);
    tmp = 0x80;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0x80;
    break;
  case EXR_ATTR_PREVIEW:
    peVar5 = (a->field_6).rational;
    tmp_2 = *(double *)peVar5;
    uStack_d0 = (uint64_t)(peVar5->num * peVar5->denom * 4);
    eVar8 = save_attr_sz(ctxt,uStack_d0 + 8);
    if (eVar8 != 0) {
      return eVar8;
    }
    eVar8 = (*ctxt->do_write)(ctxt,&tmp_2,8,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)((a->field_6).m33d)->m[2];
    break;
  case EXR_ATTR_RATIONAL:
  case EXR_ATTR_TIMECODE:
  case EXR_ATTR_V2I:
  case EXR_ATTR_V2F:
    tmp_2 = ((a->field_6).m33d)->m[0];
LAB_0011b3c7:
    tmp = 8;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 8;
    break;
  case EXR_ATTR_STRING:
    peVar7 = (a->field_6).chlist;
    eVar8 = save_attr_sz(ctxt,(long)peVar7->num_channels);
    if (eVar8 != 0) {
      return eVar8;
    }
    UNRECOVERED_JUMPTABLE_00 = ctxt->do_write;
    peVar13 = peVar7->entries;
    uVar11 = (uint64_t)peVar7->num_channels;
LAB_0011b8b1:
    eVar8 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,peVar13,uVar11,puVar1);
    return eVar8;
  case EXR_ATTR_STRING_VECTOR:
    uVar2 = ((a->field_6).chlist)->num_channels;
    uVar12 = 0;
    uVar10 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar10 = uVar12;
    }
    sz = 0;
    for (; uVar10 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
      sz = sz + (long)*(int *)(((a->field_6).chlist)->entries->reserved + (uVar12 - 0x15)) + 4;
    }
    iVar9 = save_attr_sz(ctxt,sz);
    lVar15 = 0;
    lVar16 = 0;
    while( true ) {
      if (iVar9 != 0) {
        return iVar9;
      }
      if (((a->field_6).chlist)->num_channels <= lVar16) break;
      peVar13 = ((a->field_6).chlist)->entries;
      iVar9 = save_attr_sz(ctxt,(long)*(int *)(peVar13->reserved + lVar15 + -0x15));
      if (iVar9 == 0) {
        iVar9 = (*ctxt->do_write)(ctxt,*(void **)(peVar13->reserved + lVar15 + -0xd),
                                  (long)*(int *)(peVar13->reserved + lVar15 + -0x15),puVar1);
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x10;
    }
    return 0;
  case EXR_ATTR_TILEDESC:
    tmp_2 = ((a->field_6).m33d)->m[0];
    tmp = 9;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    eVar8 = (*ctxt->do_write)(ctxt,&tmp_2,8,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = &((a->field_6).box2i)->max;
LAB_0011b9d0:
    uStack_d0 = 1;
    break;
  case EXR_ATTR_V3I:
  case EXR_ATTR_V3F:
    fStack_b0 = *(float *)(((a->field_6).m33d)->m + 1);
    tmp_2 = ((a->field_6).m33d)->m[0];
    tmp = 0xc;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0xc;
    break;
  case EXR_ATTR_V3D:
    peVar4 = (a->field_6).m33d;
    local_a8 = peVar4->m[2];
    tmp_2 = peVar4->m[0];
    fStack_b0 = *(float *)(peVar4->m + 1);
    fStack_ac = *(float *)((long)peVar4->m + 0xc);
    tmp = 0x18;
    eVar8 = (*ctxt->do_write)(ctxt,&tmp,4,puVar1);
    if (eVar8 != 0) {
      return eVar8;
    }
    peVar14 = (exr_attr_v2i_t *)&tmp_2;
    uStack_d0 = 0x18;
    break;
  case EXR_ATTR_OPAQUE:
    tmp = 0;
    tmp_2 = 0.0;
    eVar8 = exr_attr_opaquedata_pack((exr_context_t)ctxt,(a->field_6).opaque,&tmp,(void **)&tmp_2);
    if (eVar8 != 0) {
      return eVar8;
    }
    eVar8 = save_attr_sz(ctxt,(long)tmp);
    if (tmp < 1 || eVar8 != 0) {
      return eVar8;
    }
    uStack_d0 = (uint64_t)(uint)tmp;
    peVar14 = (exr_attr_v2i_t *)tmp_2;
    break;
  default:
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    uStack_d0._0_4_ = 0xe;
LAB_0011b92a:
    eVar8 = (*UNRECOVERED_JUMPTABLE)(ctxt,(exr_result_t)uStack_d0);
    return eVar8;
  }
  eVar8 = (*ctxt->do_write)(ctxt,peVar14,uStack_d0,puVar1);
  return eVar8;
}

Assistant:

static exr_result_t
save_attr (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;

    rv = ctxt->do_write (
        ctxt, a->name, a->name_length + 1, &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = ctxt->do_write (
        ctxt,
        a->type_name,
        a->type_name_length + 1,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    switch (a->type)
    {
        case EXR_ATTR_BOX2I: rv = save_box2i (ctxt, a); break;
        case EXR_ATTR_BOX2F: rv = save_box2f (ctxt, a); break;
        case EXR_ATTR_CHLIST: rv = save_chlist (ctxt, a); break;
        case EXR_ATTR_CHROMATICITIES: rv = save_chromaticities (ctxt, a); break;
        case EXR_ATTR_COMPRESSION: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_DOUBLE: rv = save_attr_double (ctxt, a); break;
        case EXR_ATTR_ENVMAP: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_FLOAT: rv = save_attr_float (ctxt, a); break;
        case EXR_ATTR_FLOAT_VECTOR: rv = save_float_vector (ctxt, a); break;
        case EXR_ATTR_INT: rv = save_attr_int (ctxt, a); break;
        case EXR_ATTR_KEYCODE: rv = save_keycode (ctxt, a); break;
        case EXR_ATTR_LINEORDER: rv = save_attr_uint8 (ctxt, a); break;
        case EXR_ATTR_M33F: rv = save_m33f (ctxt, a); break;
        case EXR_ATTR_M33D: rv = save_m33d (ctxt, a); break;
        case EXR_ATTR_M44F: rv = save_m44f (ctxt, a); break;
        case EXR_ATTR_M44D: rv = save_m44d (ctxt, a); break;
        case EXR_ATTR_PREVIEW: rv = save_preview (ctxt, a); break;
        case EXR_ATTR_RATIONAL: rv = save_rational (ctxt, a); break;
        case EXR_ATTR_STRING: rv = save_string (ctxt, a); break;
        case EXR_ATTR_STRING_VECTOR: rv = save_string_vector (ctxt, a); break;
        case EXR_ATTR_TILEDESC: rv = save_tiledesc (ctxt, a); break;
        case EXR_ATTR_TIMECODE: rv = save_timecode (ctxt, a); break;
        case EXR_ATTR_V2I: rv = save_v2i (ctxt, a); break;
        case EXR_ATTR_V2F: rv = save_v2f (ctxt, a); break;
        case EXR_ATTR_V2D: rv = save_v2d (ctxt, a); break;
        case EXR_ATTR_V3I: rv = save_v3i (ctxt, a); break;
        case EXR_ATTR_V3F: rv = save_v3f (ctxt, a); break;
        case EXR_ATTR_V3D: rv = save_v3d (ctxt, a); break;
        case EXR_ATTR_OPAQUE: rv = save_opaque (ctxt, a); break;

        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: rv = ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR); break;
    }
    return rv;
}